

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O2

void __thiscall
nigel::IMC_Generator::generateOperation
          (IMC_Generator *this,OperationCombination comb,HexOp op_val,HexOp op_const,HexOp op_atr0,
          shared_ptr<nigel::IM_Operator> *lOp,shared_ptr<nigel::IM_Operator> rOp,
          shared_ptr<nigel::Token> token)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  _func_int **in_stack_fffffffffffff6b8;
  SFR sfr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_940;
  undefined1 local_938 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_920;
  shared_ptr<nigel::IM_Operator> local_918;
  shared_ptr<nigel::IM_Operator> local_908;
  shared_ptr<nigel::IM_Operator> local_8f8;
  shared_ptr<nigel::IM_Operator> local_8e8;
  shared_ptr<nigel::IM_Operator> local_8d8;
  shared_ptr<nigel::IM_Operator> local_8c8;
  shared_ptr<nigel::IM_Operator> local_8b8;
  shared_ptr<nigel::IM_Operator> local_8a8;
  shared_ptr<nigel::IM_Operator> local_898;
  shared_ptr<nigel::IM_Operator> local_888;
  shared_ptr<nigel::IM_Operator> local_878;
  shared_ptr<nigel::IM_Operator> local_868;
  shared_ptr<nigel::IM_Operator> local_858;
  shared_ptr<nigel::IM_Operator> local_848;
  shared_ptr<nigel::IM_Operator> local_838;
  shared_ptr<nigel::IM_Operator> local_828;
  shared_ptr<nigel::IM_Operator> local_818;
  shared_ptr<nigel::IM_Operator> local_808;
  shared_ptr<nigel::IM_Operator> local_7f8;
  shared_ptr<nigel::IM_Operator> local_7e8;
  shared_ptr<nigel::IM_Operator> local_7d8;
  shared_ptr<nigel::IM_Operator> local_7c8;
  shared_ptr<nigel::IM_Operator> local_7b8;
  shared_ptr<nigel::IM_Operator> local_7a8;
  shared_ptr<nigel::IM_Operator> local_798;
  shared_ptr<nigel::IM_Operator> local_788;
  shared_ptr<nigel::IM_Operator> local_778;
  shared_ptr<nigel::IM_Operator> local_768;
  shared_ptr<nigel::IM_Operator> local_758;
  shared_ptr<nigel::IM_Operator> local_748;
  shared_ptr<nigel::IM_Operator> local_738;
  shared_ptr<nigel::IM_Operator> local_728;
  shared_ptr<nigel::IM_Operator> local_718;
  shared_ptr<nigel::IM_Operator> local_708;
  shared_ptr<nigel::IM_Operator> local_6f8;
  shared_ptr<nigel::IM_Operator> local_6e8;
  shared_ptr<nigel::IM_Operator> local_6d8;
  shared_ptr<nigel::IM_Operator> local_6c8;
  shared_ptr<nigel::IM_Operator> local_6b8;
  shared_ptr<nigel::IM_Operator> local_6a8;
  shared_ptr<nigel::IM_Operator> local_698;
  shared_ptr<nigel::IM_Operator> local_688;
  shared_ptr<nigel::IM_Operator> local_678;
  shared_ptr<nigel::IM_Operator> local_668;
  shared_ptr<nigel::IM_Operator> local_658;
  shared_ptr<nigel::IM_Operator> local_648;
  shared_ptr<nigel::IM_Operator> local_638;
  shared_ptr<nigel::IM_Operator> local_628;
  shared_ptr<nigel::IM_Operator> local_618;
  shared_ptr<nigel::IM_Operator> local_608;
  shared_ptr<nigel::IM_Operator> local_5f8;
  shared_ptr<nigel::IM_Operator> local_5e8;
  shared_ptr<nigel::IM_Operator> local_5d8;
  shared_ptr<nigel::IM_Operator> local_5c8;
  shared_ptr<nigel::IM_Operator> local_5b8;
  shared_ptr<nigel::IM_Operator> local_5a8;
  shared_ptr<nigel::IM_Operator> local_598;
  shared_ptr<nigel::IM_Operator> local_588;
  shared_ptr<nigel::IM_Operator> local_578;
  shared_ptr<nigel::IM_Operator> local_568;
  shared_ptr<nigel::IM_Operator> local_558;
  shared_ptr<nigel::IM_Operator> local_548;
  shared_ptr<nigel::IM_Operator> local_538;
  shared_ptr<nigel::IM_Operator> local_528;
  shared_ptr<nigel::IM_Operator> local_518;
  shared_ptr<nigel::IM_Operator> local_508;
  shared_ptr<nigel::IM_Operator> local_4f8;
  shared_ptr<nigel::IM_Operator> local_4e8;
  shared_ptr<nigel::IM_Operator> local_4d8;
  shared_ptr<nigel::IM_Operator> local_4c8;
  shared_ptr<nigel::IM_Operator> local_4b8;
  shared_ptr<nigel::IM_Operator> local_4a8;
  shared_ptr<nigel::IM_Operator> local_498;
  shared_ptr<nigel::IM_Operator> local_488;
  shared_ptr<nigel::IM_Operator> local_478;
  shared_ptr<nigel::IM_Operator> local_468;
  shared_ptr<nigel::IM_Operator> local_458;
  shared_ptr<nigel::IM_Operator> local_448;
  shared_ptr<nigel::IM_Operator> local_438;
  shared_ptr<nigel::IM_Operator> local_428;
  shared_ptr<nigel::IM_Operator> local_418;
  shared_ptr<nigel::IM_Operator> local_408;
  shared_ptr<nigel::IM_Operator> local_3f8;
  shared_ptr<nigel::IM_Operator> local_3e8;
  shared_ptr<nigel::IM_Operator> local_3d8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_3c8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_3b8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_3a8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_398;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_388;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_378;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> local_358;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_348;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_338;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_328;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_318;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_308;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_2f8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_2e8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_2d8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_2b8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_2a8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_298;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_288;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_278;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_268;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_258;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_248;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_238;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_218;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_208;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_1e8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_198;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_178;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_158;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_148;
  shared_ptr<nigel::IM_Operator> local_138;
  shared_ptr<nigel::IM_Operator> local_128;
  shared_ptr<nigel::IM_Operator> local_118;
  shared_ptr<nigel::IM_Operator> local_108;
  shared_ptr<nigel::IM_Operator> local_f8;
  shared_ptr<nigel::IM_Operator> local_e8;
  shared_ptr<nigel::IM_Operator> local_d8;
  shared_ptr<nigel::IM_Operator> local_c8;
  shared_ptr<nigel::IM_Operator> local_b8;
  shared_ptr<nigel::IM_Operator> local_a8;
  shared_ptr<nigel::IM_Operator> local_98;
  shared_ptr<nigel::IM_Operator> local_88;
  shared_ptr<nigel::IM_Operator> local_78;
  shared_ptr<nigel::IM_Operator> local_68;
  shared_ptr<nigel::IM_Operator> local_58;
  shared_ptr<nigel::IM_Operator> local_48;
  
  sfr = (SFR)((ulong)in_stack_fffffffffffff6b8 >> 0x20);
  switch(comb) {
  case vv:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
    if (*(int *)((long)in_stack_fffffffffffff6b8 + 0x1c) == 0) {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_938);
      iVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_938._0_8_ + 0x10))->
              _M_weak_count;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_938 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if (iVar1 == 0) {
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_148,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        local_3d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_3d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_adr,(shared_ptr<nigel::IM_Operator> *)&local_148,&local_3d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_3d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_158,
                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                   rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_3e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_3e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_val,(shared_ptr<nigel::IM_Operator> *)&local_158,&local_3e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_3e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_01 = &local_158._M_refcount;
        break;
      }
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
    }
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
    if (*(int *)((long)in_stack_fffffffffffff6b8 + 0x1c) == 1) {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_938);
      iVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_938._0_8_ + 0x10))->
              _M_weak_count;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_938 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if (iVar1 == 0) {
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_168,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        local_3f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_3f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)&local_168,&local_3f8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_3f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
        local_408.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_408.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_418.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_418.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_408,&local_418);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_418.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_408.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_178,
                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                   rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_428.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_428.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_val,(shared_ptr<nigel::IM_Operator> *)&local_178,&local_428);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_428.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_01 = &local_178._M_refcount;
        break;
      }
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
    }
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
    if ((*(int *)((long)in_stack_fffffffffffff6b8 + 0x1c) == 4) ||
       (*(int *)((long)in_stack_fffffffffffff6b8 + 0x1c) == 2)) {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_938);
      iVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_938._0_8_ + 0x10))->
              _M_weak_count;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_938 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if (iVar1 == 0) {
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_188,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        generateLoadStackR0(this,(shared_ptr<nigel::IM_Operator> *)&local_188);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_188._M_refcount);
        local_438.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_438.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_448.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_448.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_atr0,&local_438,&local_448);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_448.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_438.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_198,
                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                   rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_458.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_458.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_val,(shared_ptr<nigel::IM_Operator> *)&local_198,&local_458);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_458.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_01 = &local_198._M_refcount;
        break;
      }
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
    }
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
    if (*(int *)((long)in_stack_fffffffffffff6b8 + 0x1c) == 0) {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_938);
      iVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_938._0_8_ + 0x10))->
              _M_weak_count;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_938 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if (iVar1 == 1) {
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1a8,
                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                   rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)&local_1a8,&local_468);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
        local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_488.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_488.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_478,&local_488);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_488.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        IM_SFR::getSFR(sfr);
        local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_940._M_pi;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_498.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_498.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_adr_a,&local_48,&local_498);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_498.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1b8,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_adr,(shared_ptr<nigel::IM_Operator> *)&local_1b8,&local_4a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
        IM_SFR::getSFR(0);
        this_02 = &local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_940._M_pi;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_4b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_val,&local_58,&local_4b8);
        this_00 = &local_4b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        goto LAB_00167bd0;
      }
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
    }
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
    if (*(int *)((long)in_stack_fffffffffffff6b8 + 0x1c) == 1) {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_938);
      iVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_938._0_8_ + 0x10))->
              _M_weak_count;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_938 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if (iVar1 == 1) {
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1c8,
                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                   rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)&local_1c8,&local_4c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
        local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_4e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_4d8,&local_4e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_4e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        IM_SFR::getSFR(sfr);
        local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_940._M_pi;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_4f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_adr_a,&local_68,&local_4f8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_4f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1d8,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)&local_1d8,&local_508);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount);
        local_518.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_518.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_528.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_528.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_518,&local_528);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_528.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_518.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        IM_SFR::getSFR(0);
        this_02 = &local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_940._M_pi;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_val,&local_78,&local_538);
        this_00 = &local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        goto LAB_00167bd0;
      }
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
    }
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
    if ((*(int *)((long)in_stack_fffffffffffff6b8 + 0x1c) == 4) ||
       (*(int *)((long)in_stack_fffffffffffff6b8 + 0x1c) == 2)) {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_938);
      iVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_938._0_8_ + 0x10))->
              _M_weak_count;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_938 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if (iVar1 == 1) {
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1e8,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        generateLoadStackR0(this,(shared_ptr<nigel::IM_Operator> *)&local_1e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1f8,
                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                   rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)&local_1f8,&local_548);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
        local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_558,&local_568);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        IM_SFR::getSFR(sfr);
        local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_940._M_pi;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_adr_a,&local_88,&local_578);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
        local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_atr0,&local_588,&local_598);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        IM_SFR::getSFR(0);
        this_02 = &local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_940._M_pi;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_5a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_5a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_val,&local_98,&local_5a8);
        this_00 = &local_5a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        goto LAB_00167bd0;
      }
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
    }
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
    if (*(int *)((long)in_stack_fffffffffffff6b8 + 0x1c) == 0) {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_938);
      iVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_938._0_8_ + 0x10))->
              _M_weak_count;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_938 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if ((iVar1 == 4) || (iVar1 == 2)) {
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_208,
                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                   rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        generateLoadStackR0(this,(shared_ptr<nigel::IM_Operator> *)&local_208);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_218,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_adr,(shared_ptr<nigel::IM_Operator> *)&local_218,&local_5b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount);
        local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_5d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_5d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_atr0,&local_5c8,&local_5d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_5d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_01 = &local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        break;
      }
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
    }
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
    if (*(int *)((long)in_stack_fffffffffffff6b8 + 0x1c) == 1) {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_938);
      iVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_938._0_8_ + 0x10))->
              _M_weak_count;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_938 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if ((iVar1 == 4) || (iVar1 == 2)) {
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_228,
                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                   rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        generateLoadStackR0(this,(shared_ptr<nigel::IM_Operator> *)&local_228);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_228._M_refcount);
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_238,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)&local_238,&local_5e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_238._M_refcount);
        local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_608.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_608.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_5f8,&local_608);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_608.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        local_618.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_618.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_atr0,&local_618,&local_628);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_01 = &local_618.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        break;
      }
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
    }
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
    if ((*(int *)((long)in_stack_fffffffffffff6b8 + 0x1c) == 4) ||
       (*(int *)((long)in_stack_fffffffffffff6b8 + 0x1c) == 2)) {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_938);
      iVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_938._0_8_ + 0x10))->
              _M_weak_count;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_938 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if ((iVar1 != 4) && (iVar1 != 2)) {
        return;
      }
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_248,
                 (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                 rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      generateLoadStackR0(this,(shared_ptr<nigel::IM_Operator> *)&local_248);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_248._M_refcount);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_258,&lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                );
      generateLoadStackR1(this,(shared_ptr<nigel::IM_Operator> *)&local_258);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_258._M_refcount);
      local_638.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_638.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_atr1,&local_638,&local_648);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_638.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_668.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_668.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,op_atr0,&local_658,&local_668);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_668.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_01 = &local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    }
    else {
      this_01 = &_Stack_940;
    }
    break;
  case vc:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
    iVar1 = *(int *)((long)in_stack_fffffffffffff6b8 + 0x1c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
    if (iVar1 == 0) {
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_268,&lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                );
      local_678.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_678.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_adr,(shared_ptr<nigel::IM_Operator> *)&local_268,&local_678);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_678.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_268._M_refcount);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_278,
                 (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                 rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,op_const,(shared_ptr<nigel::IM_Operator> *)&local_278,&local_688);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_01 = &local_278._M_refcount;
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
      iVar1 = *(int *)((long)in_stack_fffffffffffff6b8 + 0x1c);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if (iVar1 == 1) {
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_288,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        local_698.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_698.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)&local_288,&local_698);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_698.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_288._M_refcount);
        local_6a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_6a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_6b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_6b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_6a8,&local_6b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_6b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_6a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_298,
                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                   rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_6c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_6c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_const,(shared_ptr<nigel::IM_Operator> *)&local_298,&local_6c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_6c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_01 = &local_298._M_refcount;
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
        iVar1 = *(int *)((long)in_stack_fffffffffffff6b8 + 0x1c);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
        if ((iVar1 != 4) && (iVar1 != 2)) {
          return;
        }
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_2a8,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        generateLoadStackR0(this,(shared_ptr<nigel::IM_Operator> *)&local_2a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a8._M_refcount);
        local_6d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_6d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_atr0,&local_6d8,&local_6e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_6d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_2b8,
                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                   rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_const,(shared_ptr<nigel::IM_Operator> *)&local_2b8,&local_6f8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_01 = &local_2b8._M_refcount;
      }
    }
    break;
  case vt:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
    iVar1 = *(int *)((long)in_stack_fffffffffffff6b8 + 0x1c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
    if (iVar1 == 0) {
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_2c8,&lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                );
      local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_adr,(shared_ptr<nigel::IM_Operator> *)&local_2c8,&local_708);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c8._M_refcount);
      IM_SFR::getSFR(sfr);
      this_02 = &local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Stack_940._M_pi;
      _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,op_val,&local_a8,&local_718);
      this_00 = &local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
      iVar1 = *(int *)((long)in_stack_fffffffffffff6b8 + 0x1c);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if (iVar1 == 1) {
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_2d8,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)&local_2d8,&local_728);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d8._M_refcount);
        local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_748.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_748.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_738,&local_748);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_748.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        IM_SFR::getSFR(sfr);
        this_02 = &local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_940._M_pi;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_758.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_758.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_val,&local_b8,&local_758);
        this_00 = &local_758.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
        iVar1 = *(int *)((long)in_stack_fffffffffffff6b8 + 0x1c);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
        if ((iVar1 != 4) && (iVar1 != 2)) {
          return;
        }
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_2e8,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        generateLoadStackR0(this,(shared_ptr<nigel::IM_Operator> *)&local_2e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e8._M_refcount);
        local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_atr0,&local_768,&local_778);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        IM_SFR::getSFR(sfr);
        this_02 = &local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_940._M_pi;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_val,&local_c8,&local_788);
        this_00 = &local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      }
    }
    goto LAB_00167bd0;
  case cv:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
    iVar1 = *(int *)((long)in_stack_fffffffffffff6b8 + 0x1c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
    if (iVar1 == 0) {
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_2f8,&lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                );
      local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_const,(shared_ptr<nigel::IM_Operator> *)&local_2f8,&local_798);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2f8._M_refcount);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_308,
                 (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                 rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,op_val,(shared_ptr<nigel::IM_Operator> *)&local_308,&local_7a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_01 = &local_308._M_refcount;
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
      iVar1 = *(int *)((long)in_stack_fffffffffffff6b8 + 0x1c);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if (iVar1 == 1) {
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_318,
                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                   rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_7b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_7b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)&local_318,&local_7b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_7b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_318._M_refcount);
        local_7c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_7c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_7c8,&local_7d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_7c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        IM_SFR::getSFR(sfr);
        local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_940._M_pi;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_adr_a,&local_d8,&local_7e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_328,
                   &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
        local_7f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_7f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_const,(shared_ptr<nigel::IM_Operator> *)&local_328,&local_7f8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_7f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_328._M_refcount);
        IM_SFR::getSFR(0);
        this_02 = &local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_940._M_pi;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_val,&local_e8,&local_808);
        this_00 = &local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        goto LAB_00167bd0;
      }
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
      iVar1 = *(int *)((long)in_stack_fffffffffffff6b8 + 0x1c);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if ((iVar1 != 4) && (iVar1 != 2)) {
        return;
      }
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_338,
                 (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                 rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      generateLoadStackR0(this,(shared_ptr<nigel::IM_Operator> *)&local_338);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_338._M_refcount);
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_348,&lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                );
      local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_const,(shared_ptr<nigel::IM_Operator> *)&local_348,&local_818);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_348._M_refcount);
      local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,op_atr0,&local_828,&local_838);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_01 = &local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    }
    break;
  case cc:
    std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_358,
               (__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
               rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,imp_operationOnTwoConstantsCanBePrevented,
               (shared_ptr<nigel::Token> *)&local_358);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_358._M_refcount);
    std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_368,&lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
    local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,mov_a_const,(shared_ptr<nigel::IM_Operator> *)&local_368,&local_848);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_368._M_refcount);
    std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_378,
               (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
               rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,op_const,(shared_ptr<nigel::IM_Operator> *)&local_378,&local_858);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    this_01 = &local_378._M_refcount;
    break;
  case ct:
    std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_388,&lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
    local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,mov_a_const,(shared_ptr<nigel::IM_Operator> *)&local_388,&local_868);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_388._M_refcount);
    IM_SFR::getSFR(sfr);
    this_02 = &local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_940._M_pi;
    _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_878.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_878.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,op_val,&local_f8,&local_878);
    this_00 = &local_878.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    goto LAB_00167bd0;
  case tv:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
    iVar1 = *(int *)((long)in_stack_fffffffffffff6b8 + 0x1c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
    if (iVar1 == 0) {
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_398,
                 (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                 rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_888.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_888.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,op_val,(shared_ptr<nigel::IM_Operator> *)&local_398,&local_888);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_888.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_01 = &local_398._M_refcount;
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
      iVar1 = *(int *)((long)in_stack_fffffffffffff6b8 + 0x1c);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if (iVar1 == 1) {
        IM_SFR::getSFR(sfr);
        local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_940._M_pi;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_898.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_898.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,xch_a_adr,&local_108,&local_898);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_898.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_3a8,
                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                   rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_8a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_8a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,(shared_ptr<nigel::IM_Operator> *)&local_3a8,&local_8a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_8a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3a8._M_refcount);
        local_8b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_8b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_8c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_8c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_8b8,&local_8c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_8c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_8b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        IM_SFR::getSFR(0);
        local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_940._M_pi;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_8d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_8d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,xch_a_adr,&local_118,&local_8d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_8d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
        IM_SFR::getSFR(0);
        this_02 = &local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_940._M_pi;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_8e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_8e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_val,&local_128,&local_8e8);
        this_00 = &local_8e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        goto LAB_00167bd0;
      }
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)&stack0xfffffffffffff6b8);
      iVar1 = *(int *)((long)in_stack_fffffffffffff6b8 + 0x1c);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
      if ((iVar1 != 4) && (iVar1 != 2)) {
        return;
      }
      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_3b8,
                 (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                 rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      generateLoadStackR0(this,(shared_ptr<nigel::IM_Operator> *)&local_3b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b8._M_refcount);
      local_8f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_8f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_908.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_908.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,op_atr0,&local_8f8,&local_908);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_908.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_01 = &local_8f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    }
    break;
  case tc:
    std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_3c8,
               (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
               rOp.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_918.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_918.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,op_const,(shared_ptr<nigel::IM_Operator> *)&local_3c8,&local_918);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_918.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    this_01 = &local_3c8._M_refcount;
    break;
  case tt:
    IM_SFR::getSFR(sfr);
    this_02 = &local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_940._M_pi;
    _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_938._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_920._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,op_val,&local_138,(shared_ptr<nigel::IM_Operator> *)(local_938 + 0x10));
    this_00 = &_Stack_920;
LAB_00167bd0:
    this_01 = &_Stack_940;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_02);
    break;
  default:
    goto switchD_0016659a_default;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
switchD_0016659a_default:
  return;
}

Assistant:

void IMC_Generator::generateOperation( OperationCombination comb, HexOp op_val, HexOp op_const, HexOp op_atr0, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<IM_Operator> rOp, std::shared_ptr<Token> token )
	{
		if( comb == OC::vv )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast &&
				rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_val, rOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_val, rOp );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
				rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_val, rOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::fast &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::fast &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_atr0 );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_atr0 );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				generateLoadStackR1( lOp );
				addCmd( HexOp::mov_a_atr1 );
				addCmd( op_atr0 );
			}
		}
		else if( comb == OC::vc )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_const, rOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_const, rOp );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_const, rOp );
			}
		}
		else if( comb == OC::vt )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
		}
		else if( comb == OC::cv )
		{
			if( rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_const, lOp );
				addCmd( op_val, rOp );
			}
			else if( rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_const, lOp );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_a_const, lOp );
				addCmd( op_atr0 );
			}
		}
		else if( comb == OC::cc )
		{
			generateNotification( NT::imp_operationOnTwoConstantsCanBePrevented, token );
			addCmd( HexOp::mov_a_const, lOp );
			addCmd( op_const, rOp );
		}
		else if( comb == OC::ct )
		{
			addCmd( HexOp::mov_a_const, lOp );
			addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
		}
		else if( comb == OC::tv )
		{
			if( rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( op_val, rOp );
			}
			else if( rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::xch_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::xch_a_adr, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( op_atr0 );
			}
		}
		else if( comb == OC::tc )
		{
			addCmd( op_const, rOp );
		}
		else if( comb == OC::tt )
		{
			addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
		}
	}